

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

int ktx::validateIOStream
              (istream *stream,string *filepath,bool warningsAsErrors,bool GLTFBasisU,
              function<void_(const_ktx::ValidationReport_&)> *callback)

{
  _Manager_type p_Var1;
  int iVar2;
  ValidationContextIOStream ctx;
  _Any_data local_398;
  _Manager_type local_388;
  _Invoker_type local_380;
  ValidationContextIOStream local_370;
  
  local_398._M_unused._M_object = (void *)0x0;
  local_398._8_8_ = 0;
  local_388 = (_Manager_type)0x0;
  local_380 = callback->_M_invoker;
  p_Var1 = (callback->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_398._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(callback->super__Function_base)._M_functor;
    local_398._8_8_ = *(undefined8 *)((long)&(callback->super__Function_base)._M_functor + 8);
    (callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    callback->_M_invoker = (_Invoker_type)0x0;
    local_388 = p_Var1;
  }
  ValidationContextIOStream::ValidationContextIOStream
            (&local_370,warningsAsErrors,GLTFBasisU,
             (function<void_(const_ktx::ValidationReport_&)> *)&local_398,stream,filepath);
  if (local_388 != (_Manager_type)0x0) {
    (*local_388)(&local_398,&local_398,__destroy_functor);
  }
  iVar2 = ValidationContext::validate(&local_370.super_ValidationContext,true);
  local_370.super_ValidationContext._vptr_ValidationContext =
       (_func_int **)&PTR__ValidationContextIOStream_00260948;
  if (local_370.ktx2Stream.
      super__Optional_base<StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>,_false,_false>
      ._M_payload.
      super__Optional_payload<StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>,_true,_false,_false>
      .
      super__Optional_payload_base<StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
      ._M_engaged == true) {
    local_370.ktx2Stream.
    super__Optional_base<StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>,_false,_false>
    ._M_payload.
    super__Optional_payload<StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>,_true,_false,_false>
    .
    super__Optional_payload_base<StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
    ._M_engaged = false;
    StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::~StreambufStream
              ((StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *)
               &local_370.ktx2Stream);
  }
  std::ifstream::~ifstream(&local_370.file);
  ValidationContext::~ValidationContext(&local_370.super_ValidationContext);
  return iVar2;
}

Assistant:

int validateIOStream(std::istream& stream, const std::string& filepath, bool warningsAsErrors, bool GLTFBasisU, std::function<void(const ValidationReport&)> callback) {
    try {
        ValidationContextIOStream ctx{warningsAsErrors, GLTFBasisU, std::move(callback), stream, filepath};
        return ctx.validate();
    } catch (const FatalValidationError&) {
        return +rc::INVALID_FILE;
    }
}